

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall mjs::object::object(object *this,string *class_name,object_ptr *prototype)

{
  gc_heap *pgVar1;
  uint32_t local_18;
  
  this->_vptr_object = (_func_int **)&PTR_get_001d7930;
  pgVar1 = (class_name->super_gc_heap_ptr<mjs::gc_string>).super_gc_heap_ptr_untyped.heap_;
  this->heap_ = pgVar1;
  (this->class_).pos_ =
       (class_name->super_gc_heap_ptr<mjs::gc_string>).super_gc_heap_ptr_untyped.pos_;
  (this->prototype_).pos_ = (prototype->super_gc_heap_ptr_untyped).pos_;
  gc_vector<mjs::object::property>::make((gc_heap *)&stack0xffffffffffffffe0,(uint32_t)pgVar1);
  (this->properties_).pos_ = local_18;
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffe0);
  this->extensible_ = true;
  return;
}

Assistant:

object::object(const string& class_name, const object_ptr& prototype)
    : heap_{class_name.heap()} // A class will always have a class_name - grab heap from that
    , class_{class_name.unsafe_raw_get()}
    , prototype_{prototype}
    , properties_{gc_vector<property>::make(heap_, 4)}
    , extensible_{true} {
}